

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O0

void __thiscall
cali::Caliper::push_snapshot_replace
          (Caliper *this,ChannelBody *chB,SnapshotView trigger_info,Entry *target)

{
  SnapshotView view;
  SnapshotBuilder *this_00;
  SnapshotView local_98;
  Caliper *local_88;
  Caliper *local_80;
  Caliper *local_78;
  Entry *pEStack_70;
  SnapshotView local_60;
  SnapshotBuilder *local_50;
  SnapshotBuilder *rec;
  lock_guard<(anonymous_namespace)::siglock> local_38;
  lock_guard<(anonymous_namespace)::siglock> g;
  Entry *target_local;
  ChannelBody *chB_local;
  Caliper *this_local;
  SnapshotView trigger_info_local;
  
  trigger_info_local.m_data = (Entry *)trigger_info.m_len;
  this_local = (Caliper *)trigger_info.m_data;
  g._M_device = (mutex_type *)target;
  std::lock_guard<(anonymous_namespace)::siglock>::lock_guard(&local_38,&this->sT->lock);
  FixedSizeSnapshotRecord<120UL>::reset(&this->sT->snapshot);
  local_50 = FixedSizeSnapshotRecord<120UL>::builder(&this->sT->snapshot);
  Blackboard::snapshot(&this->sT->thread_blackboard,local_50);
  ThreadData::update_process_snapshot
            (this->sT,&this->sG->process_blackboard,&this->sG->process_blackboard_lock);
  this_00 = local_50;
  local_60 = FixedSizeSnapshotRecord<120UL>::view(&this->sT->process_snapshot);
  SnapshotBuilder::append(this_00,local_60);
  SnapshotBuilder::remove(local_50,(char *)g._M_device);
  local_78 = this_local;
  pEStack_70 = trigger_info_local.m_data;
  view.m_len = (size_t)trigger_info_local.m_data;
  view.m_data = (Entry *)this_local;
  SnapshotBuilder::append(local_50,view);
  local_80 = this;
  util::callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotBuilder&)>::operator()
            ((callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotBuilder&)> *)
             &(chB->events).snapshot,&local_80,(SnapshotView *)&this_local,local_50);
  local_88 = this;
  local_98 = SnapshotBuilder::view(local_50);
  util::callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotView)>::operator()
            ((callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotView)> *)
             &(chB->events).process_snapshot,&local_88,(SnapshotView *)&this_local,&local_98);
  std::lock_guard<(anonymous_namespace)::siglock>::~lock_guard(&local_38);
  return;
}

Assistant:

void Caliper::push_snapshot_replace(ChannelBody* chB, SnapshotView trigger_info, const Entry& target)
{
    std::lock_guard<::siglock> g(sT->lock);

    sT->snapshot.reset();
    SnapshotBuilder& rec = sT->snapshot.builder();

    sT->thread_blackboard.snapshot(rec);
    sT->update_process_snapshot(sG->process_blackboard, sG->process_blackboard_lock);
    rec.append(sT->process_snapshot.view());

    // remove/replace target entry from blackboard snapshot
    rec.remove(target);
    rec.append(trigger_info);

    chB->events.snapshot(this, trigger_info, rec);
    chB->events.process_snapshot(this, trigger_info, rec.view());
}